

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-definition-parse.c
# Opt level: O0

int cd_mapping_init(parser_info *info,char **attr)

{
  int iVar1;
  char *__s1;
  size_t buffer_length;
  long lVar2;
  coda_ascii_integer_mapping *pcVar3;
  coda_ascii_float_mapping *pcVar4;
  double local_40;
  double value_1;
  int64_t value;
  char *value_string;
  char *ascii_string;
  char **attr_local;
  parser_info *info_local;
  
  ascii_string = (char *)attr;
  attr_local = (char **)info;
  value_string = get_mandatory_attribute_value(attr,"string",info->node->tag);
  if (value_string == (char *)0x0) {
    info_local._4_4_ = -1;
  }
  else {
    __s1 = get_mandatory_attribute_value
                     ((char **)ascii_string,"value",*(xml_element_tag *)*attr_local);
    if (__s1 == (char *)0x0) {
      info_local._4_4_ = -1;
    }
    else {
      value = (int64_t)__s1;
      if (**(int **)(*attr_local + 0x2f8) == 0x14) {
        buffer_length = strlen(__s1);
        lVar2 = coda_ascii_parse_int64(__s1,buffer_length,(int64_t *)&value_1,0);
        if (lVar2 < 0) {
          coda_set_error(-400,"invalid \'value\' attribute integer value \'%s\'",value);
          return -1;
        }
        *(code **)(*attr_local + 0x38) = coda_ascii_integer_mapping_delete;
        pcVar3 = coda_ascii_integer_mapping_new(value_string,(int64_t)value_1);
        *(coda_ascii_integer_mapping **)(*attr_local + 8) = pcVar3;
        if (*(long *)(*attr_local + 8) == 0) {
          return -1;
        }
      }
      else {
        if ((**(int **)(*attr_local + 0x2f8) != 0x11) && (**(int **)(*attr_local + 0x2f8) != 0x26))
        {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-definition-parse.c"
                        ,0x7fd,"int cd_mapping_init(parser_info *, const char **)");
        }
        iVar1 = strcasecmp(__s1,"nan");
        if (iVar1 == 0) {
          local_40 = coda_NaN();
        }
        else {
          iVar1 = strcasecmp((char *)value,"inf");
          if ((iVar1 == 0) || (iVar1 = strcasecmp((char *)value,"+inf"), iVar1 == 0)) {
            local_40 = coda_PlusInf();
          }
          else {
            iVar1 = strcasecmp((char *)value,"-inf");
            if (iVar1 == 0) {
              local_40 = coda_MinInf();
            }
            else {
              iVar1 = __isoc99_sscanf(value,"%lf",&local_40);
              if (iVar1 != 1) {
                coda_set_error(-400,"invalid \'value\' attribute float value \'%s\'",value);
                return -1;
              }
            }
          }
        }
        *(code **)(*attr_local + 0x38) = coda_ascii_float_mapping_delete;
        pcVar4 = coda_ascii_float_mapping_new(value_string,local_40);
        *(coda_ascii_float_mapping **)(*attr_local + 8) = pcVar4;
        if (*(long *)(*attr_local + 8) == 0) {
          return -1;
        }
      }
      info_local._4_4_ = 0;
    }
  }
  return info_local._4_4_;
}

Assistant:

static int cd_mapping_init(parser_info *info, const char **attr)
{
    const char *ascii_string;
    const char *value_string;

    ascii_string = get_mandatory_attribute_value(attr, "string", info->node->tag);
    if (ascii_string == NULL)
    {
        return -1;
    }
    value_string = get_mandatory_attribute_value(attr, "value", info->node->tag);
    if (value_string == NULL)
    {
        return -1;
    }
    if (info->node->parent->tag == element_cd_integer)
    {
        int64_t value;

        if (coda_ascii_parse_int64(value_string, (long)strlen(value_string), &value, 0) < 0)
        {
            coda_set_error(CODA_ERROR_DATA_DEFINITION, "invalid 'value' attribute integer value '%s'", value_string);
            return -1;
        }
        info->node->free_data = (free_data_handler)coda_ascii_integer_mapping_delete;
        info->node->data = coda_ascii_integer_mapping_new(ascii_string, value);
        if (info->node->data == NULL)
        {
            return -1;
        }
    }
    else if (info->node->parent->tag == element_cd_float || info->node->parent->tag == element_cd_time)
    {
        double value;

        if (strcasecmp(value_string, "nan") == 0)
        {
            value = coda_NaN();
        }
        else if (strcasecmp(value_string, "inf") == 0 || strcasecmp(value_string, "+inf") == 0)
        {
            value = coda_PlusInf();
        }
        else if (strcasecmp(value_string, "-inf") == 0)
        {
            value = coda_MinInf();
        }
        else if (sscanf(value_string, "%lf", &value) != 1)
        {
            coda_set_error(CODA_ERROR_DATA_DEFINITION, "invalid 'value' attribute float value '%s'", value_string);
            return -1;
        }
        info->node->free_data = (free_data_handler)coda_ascii_float_mapping_delete;
        info->node->data = coda_ascii_float_mapping_new(ascii_string, value);
        if (info->node->data == NULL)
        {
            return -1;
        }
    }
    else
    {
        assert(0);
        exit(1);
    }

    return 0;
}